

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O0

void __thiscall avro::Validator::enumAdvance(Validator *this)

{
  Validator *in_RDI;
  
  if ((in_RDI->compoundStarted_ & 1U) == 0) {
    in_RDI->waitingForCount_ = false;
    std::vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>::
    pop_back((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
              *)0x2c6390);
  }
  else {
    setWaitingForCount(in_RDI);
    in_RDI->compoundStarted_ = false;
  }
  return;
}

Assistant:

void
Validator::enumAdvance()
{
    if(compoundStarted_) {
        setWaitingForCount();
        compoundStarted_ = false;
    }
    else {
        waitingForCount_ = false;
        compoundStack_.pop_back();
    }
}